

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall Function::~Function(Function *this)

{
  bool bVar1;
  reference ppAVar2;
  Atom **i;
  iterator __end1;
  iterator __begin1;
  list<Atom_*,_std::allocator<Atom_*>_> *__range1;
  Function *this_local;
  
  __end1 = std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->body);
  i = (Atom **)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::end(&this->body);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) break;
    ppAVar2 = std::_List_iterator<Atom_*>::operator*(&__end1);
    if (*ppAVar2 != (Atom *)0x0) {
      (*(*ppAVar2)->_vptr_Atom[1])();
    }
    *ppAVar2 = (Atom *)0x0;
    std::_List_iterator<Atom_*>::operator++(&__end1);
  }
  std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::~list(&this->body);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&this->paras);
  return;
}

Assistant:

Function::~Function() {
    for (auto &i: body) {
        delete i;
        i = NULL;
    }
}